

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_mri_tables.c
# Opt level: O1

MRIStepCoupling MRIStepCoupling_Alloc(int nmat,int stages,MRISTEP_METHOD_TYPE type)

{
  ulong __nmemb;
  MRIStepCoupling MRIC;
  realtype *prVar1;
  realtype ***ppprVar2;
  realtype **pprVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  
  if (stages < 1 || nmat < 1) {
    return (MRIStepCoupling)0x0;
  }
  __nmemb = (ulong)(uint)stages;
  MRIC = (MRIStepCoupling)malloc(0x28);
  if (MRIC == (MRIStepCoupling)0x0) {
    return (MRIStepCoupling)0x0;
  }
  MRIC->nmat = nmat;
  MRIC->stages = stages;
  prVar1 = (realtype *)calloc(__nmemb,8);
  MRIC->q = 0;
  MRIC->p = 0;
  MRIC->c = (realtype *)0x0;
  MRIC->W = (realtype ***)0x0;
  MRIC->G = (realtype ***)0x0;
  MRIC->c = prVar1;
  if (prVar1 != (realtype *)0x0) {
    if ((type & ~MRISTEP_IMEX) == MRISTEP_EXPLICIT) {
      uVar4 = (ulong)(uint)nmat;
      ppprVar2 = (realtype ***)calloc(uVar4,8);
      MRIC->W = ppprVar2;
      if (ppprVar2 == (realtype ***)0x0) goto LAB_00427bae;
      if (0 < nmat) {
        uVar5 = 0;
        do {
          MRIC->W[uVar5] = (realtype **)0x0;
          pprVar3 = (realtype **)calloc(__nmemb,8);
          MRIC->W[uVar5] = pprVar3;
          if (MRIC->W[uVar5] == (realtype **)0x0) goto LAB_00427bae;
          uVar5 = uVar5 + 1;
        } while (uVar4 != uVar5);
      }
      if (0 < nmat) {
        uVar5 = 0;
        do {
          if (0 < stages) {
            uVar6 = 0;
            do {
              MRIC->W[uVar5][uVar6] = (realtype *)0x0;
              prVar1 = (realtype *)calloc(__nmemb,8);
              MRIC->W[uVar5][uVar6] = prVar1;
              if (MRIC->W[uVar5][uVar6] == (realtype *)0x0) goto LAB_00427bae;
              uVar6 = uVar6 + 1;
            } while (__nmemb != uVar6);
          }
          uVar5 = uVar5 + 1;
        } while (uVar5 != uVar4);
      }
    }
    if (1 < type - MRISTEP_IMPLICIT) {
      return MRIC;
    }
    uVar4 = (ulong)(uint)nmat;
    ppprVar2 = (realtype ***)calloc(uVar4,8);
    MRIC->G = ppprVar2;
    if (ppprVar2 != (realtype ***)0x0) {
      if (0 < nmat) {
        uVar5 = 0;
        do {
          MRIC->G[uVar5] = (realtype **)0x0;
          pprVar3 = (realtype **)calloc(__nmemb,8);
          MRIC->G[uVar5] = pprVar3;
          if (MRIC->G[uVar5] == (realtype **)0x0) goto LAB_00427bae;
          uVar5 = uVar5 + 1;
        } while (uVar4 != uVar5);
      }
      if (nmat < 1) {
        return MRIC;
      }
      uVar5 = 0;
      do {
        if (0 < stages) {
          uVar6 = 0;
          do {
            MRIC->G[uVar5][uVar6] = (realtype *)0x0;
            prVar1 = (realtype *)calloc(__nmemb,8);
            MRIC->G[uVar5][uVar6] = prVar1;
            if (MRIC->G[uVar5][uVar6] == (realtype *)0x0) goto LAB_00427bae;
            uVar6 = uVar6 + 1;
          } while (__nmemb != uVar6);
        }
        uVar5 = uVar5 + 1;
        if (uVar5 == uVar4) {
          return MRIC;
        }
      } while( true );
    }
  }
LAB_00427bae:
  MRIStepCoupling_Free(MRIC);
  return (MRIStepCoupling)0x0;
}

Assistant:

MRIStepCoupling MRIStepCoupling_Alloc(int nmat, int stages,
                                      MRISTEP_METHOD_TYPE type)
{
  int i, j;
  MRIStepCoupling MRIC = NULL;

  /* Check for legal input values */
  if (nmat < 1 || stages < 1) return(NULL);

  /* ------------------------------------------
   * Allocate and initialize coupling structure
   * ------------------------------------------ */

  MRIC = (MRIStepCoupling) malloc(sizeof(struct MRIStepCouplingMem));
  if (!MRIC) return(NULL);

  MRIC->nmat   = nmat;
  MRIC->stages = stages;
  MRIC->q      = 0;
  MRIC->p      = 0;
  MRIC->c      = NULL;
  MRIC->W      = NULL;
  MRIC->G      = NULL;

  /* --------------------------------------------
   * Allocate abscissae and coupling coefficients
   * -------------------------------------------- */

  MRIC->c = (realtype *) calloc( stages, sizeof(realtype) );
  if (!(MRIC->c)) { MRIStepCoupling_Free(MRIC); return(NULL); }

  if (type == MRISTEP_EXPLICIT || type == MRISTEP_IMEX) {

    /* allocate W matrices */
    MRIC->W = (realtype ***) calloc( nmat, sizeof(realtype**) );
    if (!(MRIC->W)) { MRIStepCoupling_Free(MRIC); return(NULL); }

    /* allocate rows of each matrix in W */
    for (i=0; i<nmat; i++) {
      MRIC->W[i] = NULL;
      MRIC->W[i] = (realtype **) calloc( stages, sizeof(realtype*) );
      if (!(MRIC->W[i])) { MRIStepCoupling_Free(MRIC); return(NULL); }
    }

    /* allocate columns of each matrix in W */
    for (i=0; i<nmat; i++)
      for (j=0; j<stages; j++) {
        MRIC->W[i][j] = NULL;
        MRIC->W[i][j] = (realtype *) calloc( stages, sizeof(realtype) );
        if (!(MRIC->W[i][j])) { MRIStepCoupling_Free(MRIC); return(NULL); }
      }
  }

  if (type == MRISTEP_IMPLICIT || type == MRISTEP_IMEX) {

    /* allocate G matrices */
    MRIC->G = (realtype ***) calloc( nmat, sizeof(realtype**) );
    if (!(MRIC->G)) { MRIStepCoupling_Free(MRIC); return(NULL); }

    /* allocate rows of each matrix in G */
    for (i=0; i<nmat; i++) {
      MRIC->G[i] = NULL;
      MRIC->G[i] = (realtype **) calloc( stages, sizeof(realtype*) );
      if (!(MRIC->G[i])) { MRIStepCoupling_Free(MRIC); return(NULL); }
    }

    /* allocate columns of each matrix in G */
    for (i=0; i<nmat; i++)
      for (j=0; j<stages; j++) {
        MRIC->G[i][j] = NULL;
        MRIC->G[i][j] = (realtype *) calloc( stages, sizeof(realtype) );
        if (!(MRIC->G[i][j])) { MRIStepCoupling_Free(MRIC); return(NULL); }
      }
  }

  return(MRIC);
}